

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VgaDebugGenerator.cpp
# Opt level: O0

void __thiscall VgaDebugGenerator::Generate_Mem(VgaDebugGenerator *this)

{
  byte bVar1;
  bool bVar2;
  _Setfill<char> _Var3;
  _Setw _Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference pbVar5;
  ulong uVar6;
  char *pcVar7;
  ostream *poVar8;
  int local_28c;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  int curr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  long local_210;
  ofstream fout;
  VgaDebugGenerator *this_local;
  
  std::operator+(&local_230,&(this->config).output_dir,&(this->config).mem_file);
  std::ofstream::ofstream(&local_210,&local_230,0x10);
  std::__cxx11::string::~string((string *)&local_230);
  bVar1 = std::ios::operator!((ios *)((long)&local_210 + *(long *)(local_210 + -0x18)));
  if ((bVar1 & 1) != 0) {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&curr,
                   "Failed to open memory file \'",&(this->config).mem_file);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&curr,"\'");
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  __range1._0_4_ = 0;
  this_00 = &(this->templte).lines;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  line = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&line), bVar2) {
    pbVar5 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    for (local_28c = 0; local_28c < (this->config).template_width; local_28c = local_28c + 1) {
      uVar6 = std::__cxx11::string::size();
      if ((ulong)(long)local_28c < uVar6) {
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_210,std::hex);
        _Var4 = std::setw(2);
        poVar8 = std::operator<<(poVar8,_Var4);
        _Var3 = std::setfill<char>('0');
        poVar8 = std::operator<<(poVar8,_Var3._M_c);
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)pbVar5);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)*pcVar7);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar8 = std::operator<<((ostream *)&local_210,"00");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      __range1._0_4_ = (int)__range1 + 1;
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  for (; (int)__range1 < this->vga_size_pow2; __range1._0_4_ = (int)__range1 + 1) {
    poVar8 = std::operator<<((ostream *)&local_210,"00");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::~ofstream(&local_210);
  return;
}

Assistant:

void VgaDebugGenerator::Generate_Mem() {
    std::ofstream fout(config.output_dir + config.mem_file);
    if (!fout) {
        throw "Failed to open memory file '" + config.mem_file + "'";
    }

    int curr = 0;
    for (const auto &line : templte.lines) {
        for (int i = 0; i < config.template_width; i++) {
            if (i < line.size()) {
                fout << std::hex << std::setw(2) << std::setfill('0') << static_cast<int>(line[i]) << std::endl;
            } else {
                fout << "00" << std::endl;
            }
            ++curr;
        }
    }
    while (curr < vga_size_pow2) {
        fout << "00" << std::endl;
        ++curr;
    }
}